

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.h
# Opt level: O2

void __thiscall
slang::ast::StructurePattern::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (StructurePattern *this,ContinuousAssignVisitor *visitor)

{
  FieldPattern *pattern;
  pointer pFVar1;
  long lVar2;
  
  pFVar1 = (this->patterns)._M_ptr;
  for (lVar2 = (this->patterns)._M_extent._M_extent_value << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    Pattern::visit<slang::analysis::NonProceduralExprVisitor>((pFVar1->pattern).ptr,visitor);
    pFVar1 = pFVar1 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& pattern : patterns)
            pattern.pattern->visit(visitor);
    }